

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicTrue_Test::Body
          (iu_SyntaxTest_x_iutest_x_VariadicTrue_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  char *in_R9;
  string local_860;
  AssertionHelper local_840;
  Fixed local_810;
  bool local_681;
  undefined1 local_680 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_650 [7];
  bool b_3;
  AssertionHelper local_630;
  Fixed local_600;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_440 [7];
  bool b_2;
  AssertionHelper local_420;
  Fixed local_3f0;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult iutest_ar_1;
  undefined1 local_230 [3];
  bool b_1;
  AssertionHelper local_210;
  Fixed local_1e0;
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  bool b;
  iu_SyntaxTest_x_iutest_x_VariadicTrue_Test *this_local;
  
  iutest_ar._39_1_ = 1;
  iutest::detail::AlwaysZero();
  local_41 = T<0,_0>::call<bool>((bool)(iutest_ar._39_1_ & 1));
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_40,&local_41);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1e0,(bool)(iutest_ar._39_1_ & 1));
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_230,(internal *)local_40,(AssertionResult *)"T<0, 0>::call(b)",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x36,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,pFVar2);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    std::__cxx11::string::~string((string *)local_230);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1._35_1_ = 1;
    iutest::detail::AlwaysZero();
    local_261 = T<0,_0>::call<bool>((bool)(iutest_ar_1._35_1_ & 1));
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_260,&local_261);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      memset(&local_3f0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3f0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3f0,(bool)(iutest_ar_1._35_1_ & 1))
      ;
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)local_440,(internal *)local_260,(AssertionResult *)"T<0, 0>::call(b)",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_420,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x38,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_420,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_420);
      std::__cxx11::string::~string((string *)local_440);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3f0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    iutest_ar_2._39_1_ = 1;
    iutest::detail::AlwaysZero();
    local_471 = T<0,_0>::call<bool>((bool)(iutest_ar_2._39_1_ & 1));
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_470,&local_471);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
    if (!bVar1) {
      memset(&local_600,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_600);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_600,(bool)(iutest_ar_2._39_1_ & 1))
      ;
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)local_650,(internal *)local_470,(AssertionResult *)"T<0, 0>::call(b)",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_630,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x3a,pcVar3,kWarning);
      iutest::AssertionHelper::operator=(&local_630,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_630);
      std::__cxx11::string::~string((string *)local_650);
      iutest::AssertionHelper::Fixed::~Fixed(&local_600);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_470);
    iutest_ar_3._39_1_ = 1;
    iutest::detail::AlwaysZero();
    local_681 = T<0,_0>::call<bool>((bool)(iutest_ar_3._39_1_ & 1));
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_680,&local_681);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
    if (!bVar1) {
      memset(&local_810,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_810);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_810,(bool)(iutest_ar_3._39_1_ & 1))
      ;
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_860,(internal *)local_680,(AssertionResult *)"T<0, 0>::call(b)","false",
                 "true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_840,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x3c,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_840,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_840);
      std::__cxx11::string::~string((string *)&local_860);
      iutest::AssertionHelper::Fixed::~Fixed(&local_810);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicTrue)
{
    if( bool b = true )
        IUTEST_ASSERT_TRUE(T<0, 0>::call(b)) << b;
    if( bool b = true )
        IUTEST_EXPECT_TRUE(T<0, 0>::call(b)) << b;
    if( bool b = true )
        IUTEST_INFORM_TRUE(T<0, 0>::call(b)) << b;
    if( bool b = true )
        IUTEST_ASSUME_TRUE(T<0, 0>::call(b)) << b;
}